

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::init
          (TextureCubeArrayFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
  *pvVar1;
  pointer pPVar2;
  TextureFormat TVar3;
  TextureFormat TVar4;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  int extraout_EAX;
  TextureCubeArray *pTVar7;
  ulong uVar8;
  ulong uVar9;
  RenderTarget *pRVar10;
  NotSupportedError *this_00;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  float fVar20;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  PixelBufferAccess levelBuf;
  RGBA local_160;
  RGBA local_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  long local_140;
  PixelBufferAccess local_138;
  Vec4 gMax;
  Vec4 gMin;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Vector<float,_4> res_3;
  int local_b8 [16];
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar5) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_cube_map_array");
    if (!bVar5) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      fmtInfo.valueMin.m_data._0_8_ = &fmtInfo.valueMax;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fmtInfo,"GL_EXT_texture_cube_map_array not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&fmtInfo);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  texFmt = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  uVar14 = this->m_size;
  uVar18 = 0x20;
  if (uVar14 != 0) {
    uVar18 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = uVar18 ^ 0x1f;
  }
  local_158 = fmtInfo.valueMin.m_data[0];
  fStack_154 = fmtInfo.valueMin.m_data[1];
  fStack_150 = fmtInfo.valueMin.m_data[2];
  fStack_14c = fmtInfo.valueMin.m_data[3];
  iVar19 = this->m_depth;
  pTVar7 = (TextureCubeArray *)operator_new(0x68);
  glu::TextureCubeArray::TextureCubeArray
            (pTVar7,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,uVar14,
             iVar19);
  this->m_gradientTex = pTVar7;
  pTVar7 = (TextureCubeArray *)operator_new(0x68);
  local_140 = (long)iVar19;
  glu::TextureCubeArray::TextureCubeArray
            (pTVar7,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_size,this->m_depth);
  this->m_gridTex = pTVar7;
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_b8[3] = 3;
  local_b8[4] = 2;
  local_b8[5] = 1;
  local_b8[6] = 3;
  local_b8[7] = 0;
  local_b8[8] = 3;
  local_b8[9] = 0;
  local_b8[10] = 1;
  local_b8[0xb] = 2;
  local_b8[0xc] = 1;
  local_b8[0xd] = 3;
  local_b8[0xe] = 2;
  local_b8[0xf] = 0;
  if (uVar14 != 0) {
    local_1b8 = fmtInfo.valueMax.m_data[0];
    fStack_1b4 = fmtInfo.valueMax.m_data[1];
    fStack_1b0 = fmtInfo.valueMax.m_data[2];
    fStack_1ac = fmtInfo.valueMax.m_data[3];
    local_1b8 = local_1b8 - local_158;
    fStack_1b4 = fStack_1b4 - fStack_154;
    fStack_1b0 = fStack_1b0 - fStack_150;
    fStack_1ac = fStack_1ac - fStack_14c;
    iVar6 = 0x1f - uVar18;
    lVar15 = 0;
    iVar19 = 0;
    if (0 < iVar6) {
      iVar19 = iVar6;
    }
    uVar9 = 0;
    do {
      tcu::TextureCubeArray::allocLevel(&this->m_gradientTex->m_refTexture,(int)uVar9);
      pPVar2 = (this->m_gradientTex->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar2 + uVar9);
      lVar11 = 2;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar11 * 4 + lVar15 + -8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 5);
      lVar11 = 5;
      do {
        levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] =
             *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar11 * 4 + lVar15 + -8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      levelBuf.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar2 + uVar9) + 4);
      if (0 < this->m_depth) {
        uVar16 = 0;
        iVar13 = 0;
        do {
          uVar8 = (ulong)(uVar16 & 0x30);
          lVar12 = (long)*(int *)((long)local_b8 + uVar8 + 4);
          lVar17 = (long)*(int *)((long)local_b8 + uVar8 + 8);
          lVar11 = (long)*(int *)((long)local_b8 + uVar8 + 0xc);
          local_138.super_ConstPixelBufferAccess.m_format.order = R;
          local_138.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_138.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_138.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
          gMin.m_data[0] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data
                      [(long)*(int *)((long)local_b8 + uVar8) + -2] * local_1b8 + local_158;
          gMin.m_data[1] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2] * fStack_1b4
               + fStack_154;
          gMin.m_data[2] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar17 + -2] * fStack_1b0
               + fStack_150;
          gMin.m_data[3] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] * fStack_1ac
               + fStack_14c;
          local_138.super_ConstPixelBufferAccess.m_format.order = 0x3f800000;
          local_138.super_ConstPixelBufferAccess.m_format.type = 0x3f800000;
          local_138.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
          local_138.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          gMax.m_data[0] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data
                      [(long)*(int *)((long)local_b8 + uVar8) + -2] * local_1b8 + local_158;
          gMax.m_data[1] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2] * fStack_1b4
               + fStack_154;
          gMax.m_data[2] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar17 + -2] * fStack_1b0
               + fStack_150;
          gMax.m_data[3] =
               (float)local_138.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] * fStack_1ac
               + fStack_14c;
          tcu::getSubregion(&local_138,&levelBuf,0,0,iVar13,
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                            levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
          tcu::fillWithComponentGradients(&local_138,&gMin,&gMax);
          iVar13 = iVar13 + 1;
          uVar16 = uVar16 + 0x10;
        } while (iVar13 < this->m_depth);
      }
      uVar9 = uVar9 + 1;
      lVar15 = lVar15 + 0x28;
    } while (uVar9 != iVar19 + 1);
    if (uVar14 != 0) {
      lVar15 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      uVar9 = 0;
      do {
        tcu::TextureCubeArray::allocLevel(&this->m_gridTex->m_refTexture,(int)uVar9);
        pPVar2 = (this->m_gridTex->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        levelBuf.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar2 + uVar9);
        lVar11 = 2;
        do {
          levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar11 * 4 + lVar15 + -8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        lVar11 = 5;
        do {
          levelBuf.super_ConstPixelBufferAccess.m_size.m_data[lVar11 + -2] =
               *(int *)((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar11 * 4 + lVar15 + -8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        levelBuf.super_ConstPixelBufferAccess.m_data =
             *(void **)((TextureFormat *)(pPVar2 + uVar9) + 4);
        iVar19 = this->m_depth;
        if (0 < iVar19) {
          iVar13 = 0;
          uVar8 = uVar9 & 0xffffffff;
          do {
            tcu::getSubregion(&local_138,&levelBuf,0,0,iVar13,
                              levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0],
                              levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1],1);
            uVar14 = (int)(0xffffff / (long)(int)(iVar19 * (0x20 - uVar18) + -1)) * (int)uVar8;
            local_15c.m_value = uVar14 | 0xff000000;
            tcu::RGBA::toVec(&local_15c);
            local_160.m_value = ~uVar14 | 0xff000000;
            gMin.m_data[0] = gMax.m_data[0] * local_1b8 + local_158;
            gMin.m_data[1] = gMax.m_data[1] * fStack_1b4 + fStack_154;
            gMin.m_data[2] = gMax.m_data[2] * fStack_1b0 + fStack_150;
            gMin.m_data[3] = gMax.m_data[3] * fStack_1ac + fStack_14c;
            tcu::RGBA::toVec(&local_160);
            res_3.m_data[0] = local_d8 * local_1b8 + local_158;
            res_3.m_data[1] = fStack_d4 * fStack_1b4 + fStack_154;
            res_3.m_data[2] = fStack_d0 * fStack_1b0 + fStack_150;
            res_3.m_data[3] = fStack_cc * fStack_1ac + fStack_14c;
            tcu::fillWithGrid(&local_138,4,&gMin,&res_3);
            iVar13 = iVar13 + 1;
            iVar19 = this->m_depth;
            uVar8 = (ulong)((int)uVar8 + (0x20 - uVar18));
          } while (iVar13 < iVar19);
        }
        uVar9 = uVar9 + 1;
        lVar15 = lVar15 + 0x28;
      } while (uVar9 != iVar6 + 1);
    }
  }
  glu::TextureCubeArray::upload(this->m_gradientTex);
  glu::TextureCubeArray::upload(this->m_gridTex);
  iVar19 = (int)((ulong)(local_140 * 0x2aaaaaab) >> 0x20);
  iVar19 = iVar19 - (iVar19 >> 0x1f);
  TVar3 = (TextureFormat)this->m_gradientTex;
  TVar4 = (TextureFormat)this->m_gridTex;
  if (this->m_onlySampleFaceInterior == true) {
    pvVar1 = &this->m_cases;
    fVar20 = (float)iVar19 + 0.5;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar20;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f266666;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)fVar20;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3e4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f19999a;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
  }
  else {
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = pRVar10->m_numSamples;
    pvVar1 = &this->m_cases;
    fVar20 = (float)iVar19 + 0.5;
    if (iVar6 == 0) {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40600000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40666666;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f99999a;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3fa00000;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar20;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
    else {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4067ae14;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x4059999a;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f8ccccd;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3faccccd;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar20;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f4ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3fa00000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f99999a;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)fVar20;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4067ae14;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x4059999a;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f8ccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3faccccd;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)fVar20;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40666666;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40733333;
    levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x40b33333;
    levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = -0x41000000;
    levelBuf.super_ConstPixelBufferAccess.m_format = TVar4;
    std::
    vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
              (pvVar1,(FilterCase *)&levelBuf);
    if (0xb < (int)local_140 && iVar6 == 0) {
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40000000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40400000;
      levelBuf.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x42333333;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f666666;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x3fc00054;
      levelBuf.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0x3fbfffac;
      levelBuf.super_ConstPixelBufferAccess.m_format = TVar3;
      std::
      vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ::emplace_back<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>
                (pvVar1,(FilterCase *)&levelBuf);
    }
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeArrayFilteringCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_cube_map_array"))
		throw tcu::NotSupportedError("GL_EXT_texture_cube_map_array not supported");

	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(m_size) + 1;
		const int						numLayers	= m_depth / 6;

		// Create textures.
		m_gradientTex	= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);
		m_gridTex		= new glu::TextureCubeArray(m_context.getRenderContext(), m_internalFormat, m_size, m_depth);

		const tcu::IVec4 levelSwz[] =
		{
			tcu::IVec4(0,1,2,3),
			tcu::IVec4(2,1,3,0),
			tcu::IVec4(3,0,1,2),
			tcu::IVec4(1,3,2,0),
		};

		// Fill first gradient texture (gradient direction varies between layers).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gradientTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gradientTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const tcu::IVec4	swz		= levelSwz[layerFaceNdx % DE_LENGTH_OF_ARRAY(levelSwz)];
				const tcu::Vec4		gMin	= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;
				const tcu::Vec4		gMax	= tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f).swizzle(swz[0],swz[1],swz[2],swz[3])*cScale + cBias;

				tcu::fillWithComponentGradients(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1), gMin, gMax);
			}
		}

		// Fill second with grid texture (each layer has unique colors).
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_gridTex->getRefTexture().allocLevel(levelNdx);

			const tcu::PixelBufferAccess levelBuf = m_gridTex->getRefTexture().getLevel(levelNdx);

			for (int layerFaceNdx = 0; layerFaceNdx < m_depth; layerFaceNdx++)
			{
				const deUint32	step	= 0x00ffffff / (numLevels*m_depth - 1);
				const deUint32	rgb		= step * (levelNdx + layerFaceNdx*numLevels);
				const deUint32	colorA	= 0xff000000 | rgb;
				const deUint32	colorB	= 0xff000000 | ~rgb;

				tcu::fillWithGrid(tcu::getSubregion(levelBuf, 0, 0, layerFaceNdx, levelBuf.getWidth(), levelBuf.getHeight(), 1),
								  4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		{
			const glu::TextureCubeArray* const	tex0	= m_gradientTex;
			const glu::TextureCubeArray* const	tex1	= m_gridTex;

			if (m_onlySampleFaceInterior)
			{
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// minification
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.5f, 0.65f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(0.8f,  0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(0.2f, 0.2f),	tcu::Vec2(0.6f,  0.5f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification
			}
			else
			{
				const bool isSingleSample = (m_context.getRenderTarget().getNumSamples() == 0);

				// minification - w/ tweak to avoid hitting triangle edges with a face switchpoint in multisample configs
				if (isSingleSample)
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));
				else
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f), tcu::Vec2(-0.5f, float(numLayers)+0.5f)));

				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.8f, 0.8f),		tcu::Vec2(1.25f, 1.20f),	tcu::Vec2(-0.5f, float(numLayers)+0.5f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.19f, -1.3f),	tcu::Vec2(1.1f, 1.35f),		tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.2f, -1.1f),		tcu::Vec2(-0.8f, -0.8f),	tcu::Vec2(float(numLayers)+0.5f, -0.5f)));	// magnification

				// Layer rounding - only in single-sample configs as multisample configs may produce smooth transition at the middle.
				if (isSingleSample && (numLayers > 1))
					m_cases.push_back(FilterCase(tex0,	tcu::Vec2(-2.0f, -1.5f  ),	tcu::Vec2(-0.1f,  0.9f), tcu::Vec2(1.50001f, 1.49999f)));
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		TextureCubeArrayFilteringCase::deinit();
		throw;
	}
}